

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_test.cc
# Opt level: O3

vector<int,_std::allocator<int>_> * anon_unknown.dwarf_5c5a51::AllCurves(void)

{
  iterator __position;
  size_t __n;
  vector<int,_std::allocator<int>_> *pvVar1;
  vector<int,_std::allocator<int>_> *extraout_RAX;
  vector<int,_std::allocator<int>_> *extraout_RAX_00;
  vector<int,std::allocator<int>> *in_RDI;
  anon_struct_16_2_e7b2e0df *curve;
  EC_builtin_curve *__args;
  vector<EC_builtin_curve,_std::allocator<EC_builtin_curve>_> curves;
  allocator_type local_31;
  vector<EC_builtin_curve,_std::allocator<EC_builtin_curve>_> local_30;
  
  __n = EC_get_builtin_curves((EC_builtin_curve *)0x0,0);
  std::vector<EC_builtin_curve,_std::allocator<EC_builtin_curve>_>::vector(&local_30,__n,&local_31);
  pvVar1 = (vector<int,_std::allocator<int>_> *)
           EC_get_builtin_curves
                     ((EC_builtin_curve *)
                      local_30.
                      super__Vector_base<EC_builtin_curve,_std::allocator<EC_builtin_curve>_>.
                      _M_impl.super__Vector_impl_data._M_start,__n);
  *(undefined8 *)in_RDI = 0;
  *(undefined8 *)(in_RDI + 8) = 0;
  *(undefined8 *)(in_RDI + 0x10) = 0;
  for (__args = (EC_builtin_curve *)
                local_30.super__Vector_base<EC_builtin_curve,_std::allocator<EC_builtin_curve>_>.
                _M_impl.super__Vector_impl_data._M_start;
      __args != (EC_builtin_curve *)
                local_30.super__Vector_base<EC_builtin_curve,_std::allocator<EC_builtin_curve>_>.
                _M_impl.super__Vector_impl_data._M_finish; __args = __args + 1) {
    __position._M_current = *(int **)(in_RDI + 8);
    if (__position._M_current == *(int **)(in_RDI + 0x10)) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                (in_RDI,__position,&__args->nid);
      pvVar1 = extraout_RAX;
    }
    else {
      pvVar1 = (vector<int,_std::allocator<int>_> *)(ulong)(uint)__args->nid;
      *__position._M_current = __args->nid;
      *(int **)(in_RDI + 8) = __position._M_current + 1;
    }
  }
  if (local_30.super__Vector_base<EC_builtin_curve,_std::allocator<EC_builtin_curve>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.super__Vector_base<EC_builtin_curve,_std::allocator<EC_builtin_curve>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_30.
                          super__Vector_base<EC_builtin_curve,_std::allocator<EC_builtin_curve>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.
                          super__Vector_base<EC_builtin_curve,_std::allocator<EC_builtin_curve>_>.
                          _M_impl.super__Vector_impl_data._M_start);
    pvVar1 = extraout_RAX_00;
  }
  return pvVar1;
}

Assistant:

static std::vector<int> AllCurves() {
  const size_t num_curves = EC_get_builtin_curves(nullptr, 0);
  std::vector<EC_builtin_curve> curves(num_curves);
  EC_get_builtin_curves(curves.data(), num_curves);
  std::vector<int> nids;
  for (const auto &curve : curves) {
    nids.push_back(curve.nid);
  }
  return nids;
}